

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ElementSelectSyntax::setChild
          (ElementSelectSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  SelectorSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ElementSelectSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->openBracket).kind = (undefined2)local_28;
    (this->openBracket).field_0x2 = local_28._2_1_;
    (this->openBracket).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->openBracket).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->openBracket).info = local_20;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_138 = (SelectorSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::SelectorSyntax>(pSVar1);
    }
    this->selector = local_138;
  }
  else {
    if (index != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_b8,&local_d8,":");
      std::__cxx11::to_string(&local_110,0x134d);
      std::operator+(&local_98,&local_b8,&local_110);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_58);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->closeBracket).kind = (undefined2)local_38;
    (this->closeBracket).field_0x2 = local_38._2_1_;
    (this->closeBracket).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->closeBracket).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->closeBracket).info = local_30;
  }
  return;
}

Assistant:

void ElementSelectSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBracket = child.token(); return;
        case 1: selector = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 2: closeBracket = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}